

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.hpp
# Opt level: O2

void remora::bindings::
     gemm<remora::dense_matrix_adaptor<double,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::column_major,remora::column_major,remora::dense_tag,remora::dense_tag>
               (value_type alpha,undefined8 *e1,undefined8 *e2,undefined8 *m)

{
  undefined1 auVar1 [16];
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  undefined8 local_8;
  
  local_20 = *m;
  local_8 = m[3];
  auVar1 = *(undefined1 (*) [16])(m + 1);
  local_18._0_8_ = auVar1._8_8_;
  local_18._8_4_ = auVar1._0_4_;
  local_18._12_4_ = auVar1._4_4_;
  local_40 = *e2;
  local_28 = e2[3];
  auVar1 = *(undefined1 (*) [16])(e2 + 1);
  local_38._0_8_ = auVar1._8_8_;
  local_38._8_4_ = auVar1._0_4_;
  local_38._12_4_ = auVar1._4_4_;
  local_60 = *e1;
  local_48 = e1[3];
  auVar1 = *(undefined1 (*) [16])(e1 + 1);
  local_58._0_8_ = auVar1._8_8_;
  local_58._8_4_ = auVar1._0_4_;
  local_58._12_4_ = auVar1._4_4_;
  dense_gemm<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>>
            ((matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)&local_40,
             (matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)&local_60,
             (matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)&local_20,alpha);
  return;
}

Assistant:

void gemm(
		matrix_expression<E1, cpu_tag> const& e1,
		matrix_expression<E2, cpu_tag> const& e2,
		matrix_expression<M, cpu_tag>& m,
		typename M::value_type alpha,
		column_major, Orientation1, Orientation2,
		Tag1, Tag2
	){
		auto transposedM = trans(m);
		typedef typename Orientation1::transposed_orientation transpO1;
		typedef typename Orientation2::transposed_orientation transpO2;
		gemm(trans(e2),trans(e1),transposedM,alpha,row_major(),transpO2(),transpO1(), Tag2(),Tag1());
	}